

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathUtil.cpp
# Opt level: O2

string * opencollada::Path::RemoveDotSegments(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  bool bVar2;
  __type _Var3;
  long lVar4;
  string *psVar5;
  char *pcVar6;
  char cVar7;
  string input;
  string local_50 [32];
  
  ::std::__cxx11::string::string((string *)&input,(string *)path);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
LAB_0012ef1c:
  while( true ) {
    while( true ) {
      while( true ) {
        if (input._M_string_length == 0) {
          ::std::__cxx11::string::~string((string *)&input);
          return __return_storage_ptr__;
        }
        bVar2 = String::StartsWith((string *)&input,(string *)dot_dot_slash_abi_cxx11_);
        if ((!bVar2) &&
           (bVar2 = String::StartsWith((string *)&input,(string *)dot_slash_abi_cxx11_), !bVar2))
        break;
        ::std::__cxx11::string::erase((ulong)&input,0);
      }
      bVar2 = String::StartsWith((string *)&input,(string *)slash_dot_slash_abi_cxx11_);
      pcVar6 = slash_dot_slash_len;
      if ((!bVar2) &&
         ((bVar2 = String::StartsWith((string *)&input,(string *)slash_dot_abi_cxx11_), !bVar2 ||
          ((pcVar6 = slash_dot_len, input._M_dataplus._M_p[(long)slash_dot_len] != '\0' &&
           (input._M_dataplus._M_p[(long)slash_dot_len] != '/')))))) break;
      ::std::__cxx11::string::replace((ulong)&input,0,pcVar6);
    }
    bVar2 = String::StartsWith((string *)&input,(string *)slash_dot_dot_slash_abi_cxx11_);
    psVar5 = (string *)__return_storage_ptr__;
    if (!bVar2) break;
    ::std::__cxx11::string::replace((ulong)&input,0,slash_dot_dot_slash_len);
    lVar4 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
    if (lVar4 == -1) goto LAB_0012f0ae;
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    ::std::__cxx11::string::erase
              (__return_storage_ptr__,pcVar1 + lVar4,
               pcVar1 + __return_storage_ptr__->_M_string_length);
  }
  bVar2 = String::StartsWith((string *)&input,(string *)slash_dot_dot_abi_cxx11_);
  if ((bVar2) &&
     ((input._M_dataplus._M_p[(long)slash_dot_dot_len] == '/' ||
      (input._M_dataplus._M_p[(long)slash_dot_dot_len] == '\0')))) {
    ::std::__cxx11::string::replace((ulong)&input,0,slash_dot_dot_len);
    lVar4 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
    if (lVar4 != -1) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      ::std::__cxx11::string::erase
                (__return_storage_ptr__,pcVar1 + lVar4,
                 pcVar1 + __return_storage_ptr__->_M_string_length);
      goto LAB_0012ef1c;
    }
  }
  else {
    _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &input,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)dot_abi_cxx11_);
    psVar5 = (string *)&input;
    if ((!_Var3) &&
       (_Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&input,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)dot_dot_abi_cxx11_), !_Var3)) {
      cVar7 = (char)(string *)&input;
      ::std::__cxx11::string::find(cVar7,0x2f);
      ::std::__cxx11::string::find(cVar7,0x2f);
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)&input);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string(local_50);
      ::std::__cxx11::string::erase((ulong)&input,0);
      goto LAB_0012ef1c;
    }
  }
LAB_0012f0ae:
  psVar5->_M_string_length = 0;
  *(psVar5->_M_dataplus)._M_p = '\0';
  goto LAB_0012ef1c;
}

Assistant:

string Path::RemoveDotSegments(const string & path)
	{
		string input = path;
		string output;
		output.reserve(input.length());

#if defined(_WIN32)
		bool contains_anti_slash = String::Replace(input, '\\', '/') > 0;
#endif

		while (!input.empty())
		{
			if (String::StartsWith(input, dot_dot_slash))
			{
				input.erase(0, dot_dot_slash_len);
			}
			else if (String::StartsWith(input, dot_slash))
			{
				input.erase(0, dot_slash_len);
			}
			else if (String::StartsWith(input, slash_dot_slash))
			{
				input.replace(0, slash_dot_slash_len, "/");
			}
			else if (String::StartsWith(input, slash_dot) &&
				(input[slash_dot_len] == '/' || input[slash_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_len, "/");
			}
			else if (String::StartsWith(input, slash_dot_dot_slash))
			{
				input.replace(0, slash_dot_dot_slash_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (String::StartsWith(input, slash_dot_dot) &&
				(input[slash_dot_dot_len] == '/' || input[slash_dot_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_dot_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (input == dot || input == dot_dot)
			{
				input.clear();
			}
			else
			{
				size_t begin = input.find('/');
				if (begin == 0)
					begin = 0;
				size_t end = input.find('/', 1);
				output.append(input.substr(0, end));
				input.erase(0, end);
			}
		}

#if defined(_WIN32)
		if (contains_anti_slash)
			String::Replace(output, '/', '\\');
#endif

		return output;
	}